

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O2

EStatusCode __thiscall
EncryptionHelper::WriteState
          (EncryptionHelper *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  bool inValue;
  EStatusCode EVar1;
  DictionaryContext *this_00;
  ByteList *inByteList;
  allocator<char> local_49;
  string local_48;
  
  EVar1 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar1 == eSuccess) {
    this_00 = ObjectsContext::StartDictionary(inStateWriter);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Type",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"EncryptionHelper",&local_49);
    DictionaryContext::WriteNameValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mIsDocumentEncrypted",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteBooleanValue(this_00,this->mIsDocumentEncrypted);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mSupportsEncryption",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteBooleanValue(this_00,this->mSupportsEncryption);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mUsingAES",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (this->mXcryptAuthentication == (XCryptionCommon *)0x0) {
      inValue = false;
    }
    else {
      inValue = XCryptionCommon::IsUsingAES(this->mXcryptAuthentication);
    }
    DictionaryContext::WriteBooleanValue(this_00,inValue);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mLength",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mLength);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mV",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mV);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mRevision",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mRevision);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mP",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteIntegerValue(this_00,this->mP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mEncryptMetaData",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteBooleanValue(this_00,this->mEncryptMetaData);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mFileIDPart1",&local_49)
    ;
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    XCryptionCommon::ByteListToString(&local_48,&this->mFileIDPart1);
    DictionaryContext::WriteLiteralStringValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mO",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    XCryptionCommon::ByteListToString(&local_48,&this->mO);
    DictionaryContext::WriteLiteralStringValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mU",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    XCryptionCommon::ByteListToString(&local_48,&this->mU);
    DictionaryContext::WriteLiteralStringValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"InitialEncryptionKey",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (this->mXcryptAuthentication == (XCryptionCommon *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    }
    else {
      inByteList = XCryptionCommon::GetInitialEncryptionKey_abi_cxx11_(this->mXcryptAuthentication);
      XCryptionCommon::ByteListToString(&local_48,inByteList);
    }
    DictionaryContext::WriteLiteralStringValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    ObjectsContext::EndDictionary(inStateWriter,this_00);
    ObjectsContext::EndIndirectObject(inStateWriter);
  }
  return EVar1;
}

Assistant:

EStatusCode EncryptionHelper::WriteState(ObjectsContext* inStateWriter, ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != eSuccess)
		return status;
	DictionaryContext* encryptionObject = inStateWriter->StartDictionary();

	encryptionObject->WriteKey("Type");
	encryptionObject->WriteNameValue("EncryptionHelper");

	encryptionObject->WriteKey("mIsDocumentEncrypted");
	encryptionObject->WriteBooleanValue(mIsDocumentEncrypted);

	encryptionObject->WriteKey("mSupportsEncryption");
	encryptionObject->WriteBooleanValue(mSupportsEncryption);

	encryptionObject->WriteKey("mUsingAES");
	encryptionObject->WriteBooleanValue(mXcryptAuthentication ? mXcryptAuthentication->IsUsingAES():false);

	encryptionObject->WriteKey("mLength");
	encryptionObject->WriteIntegerValue(mLength);

	encryptionObject->WriteKey("mV");
	encryptionObject->WriteIntegerValue(mV);

	encryptionObject->WriteKey("mRevision");
	encryptionObject->WriteIntegerValue(mRevision);

	encryptionObject->WriteKey("mP");
	encryptionObject->WriteIntegerValue(mP);

	encryptionObject->WriteKey("mEncryptMetaData");
	encryptionObject->WriteBooleanValue(mEncryptMetaData);

	encryptionObject->WriteKey("mFileIDPart1");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mFileIDPart1));

	encryptionObject->WriteKey("mO");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mO));

	encryptionObject->WriteKey("mU");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mU));

	encryptionObject->WriteKey("InitialEncryptionKey");
	encryptionObject->WriteLiteralStringValue(mXcryptAuthentication ? XCryptionCommon::ByteListToString(mXcryptAuthentication->GetInitialEncryptionKey()) : "");

	inStateWriter->EndDictionary(encryptionObject);
	inStateWriter->EndIndirectObject();

	return status;
}